

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReductionTypeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  uint32_t uVar3;
  pointer pcVar4;
  long lVar5;
  bool bVar6;
  long *plVar7;
  long lVar8;
  size_type *psVar9;
  Result *_result;
  long lVar10;
  long lVar11;
  string err;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar6 = Result::good(__return_storage_ptr__);
  if (bVar6) {
    pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != paVar1) {
      operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
    }
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar6 = Result::good(__return_storage_ptr__);
    if (bVar6) {
      pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != paVar1) {
        operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
      }
      if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
        iVar2 = *(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0]
                        + 0x24);
        lVar11 = (long)iVar2;
        std::operator+(&local_48,
                       "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_48);
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_68.field_2._M_allocated_capacity = *psVar9;
          local_68.field_2._8_8_ = plVar7[3];
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        }
        else {
          local_68.field_2._M_allocated_capacity = *psVar9;
          local_68._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_68._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        uVar3 = layer->_oneof_case_[0];
        bVar6 = true;
        if ((int)uVar3 < 0x4fb) {
          if ((int)uVar3 < 0x4ec) {
            if (uVar3 == 0x4e2) {
              lVar8 = (long)(((layer->layer_).convolution_)->kernelsize_).current_size_;
              if (lVar8 != 0) {
                lVar10 = 0;
                do {
                  lVar5 = *(long *)((long)(((layer->layer_).convolution_)->kernelsize_).
                                          arena_or_elements_ + lVar10);
                  if ((SBORROW8(lVar5,-lVar11) != lVar5 + lVar11 < 0) || (lVar11 <= lVar5)) {
                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_68);
                    goto LAB_0034dc40;
                  }
                  lVar10 = lVar10 + 8;
                } while (lVar8 * 8 != lVar10);
              }
            }
            else if (uVar3 == 0x4e7) {
              lVar8 = (long)(((layer->layer_).convolution_)->kernelsize_).current_size_;
              if (lVar8 != 0) {
                lVar10 = 0;
                do {
                  lVar5 = *(long *)((long)(((layer->layer_).convolution_)->kernelsize_).
                                          arena_or_elements_ + lVar10);
                  if ((SBORROW8(lVar5,-lVar11) != lVar5 + lVar11 < 0) || (lVar11 <= lVar5)) {
                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_68);
                    goto LAB_0034dc40;
                  }
                  lVar10 = lVar10 + 8;
                } while (lVar8 * 8 != lVar10);
              }
            }
          }
          else if (uVar3 == 0x4ec) {
            lVar8 = (long)(((layer->layer_).convolution_)->kernelsize_).current_size_;
            if (lVar8 != 0) {
              lVar10 = 0;
              do {
                lVar5 = *(long *)((long)(((layer->layer_).convolution_)->kernelsize_).
                                        arena_or_elements_ + lVar10);
                if ((SBORROW8(lVar5,-lVar11) != lVar5 + lVar11 < 0) || (lVar11 <= lVar5)) {
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_68);
                  goto LAB_0034dc40;
                }
                lVar10 = lVar10 + 8;
              } while (lVar8 * 8 != lVar10);
            }
          }
          else if (uVar3 == 0x4f1) {
            lVar8 = (long)(((layer->layer_).convolution_)->kernelsize_).current_size_;
            if (lVar8 != 0) {
              lVar10 = 0;
              do {
                lVar5 = *(long *)((long)(((layer->layer_).convolution_)->kernelsize_).
                                        arena_or_elements_ + lVar10);
                if ((SBORROW8(lVar5,-lVar11) != lVar5 + lVar11 < 0) || (lVar11 <= lVar5)) {
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_68);
                  goto LAB_0034dc40;
                }
                lVar10 = lVar10 + 8;
              } while (lVar8 * 8 != lVar10);
            }
          }
          else if (uVar3 == 0x4f6) {
            lVar8 = (long)(((layer->layer_).convolution_)->kernelsize_).current_size_;
            if (lVar8 != 0) {
              lVar10 = 0;
LAB_0034d87a:
              lVar5 = *(long *)((long)(((layer->layer_).convolution_)->kernelsize_).
                                      arena_or_elements_ + lVar10);
              if ((-iVar2 <= lVar5) && (lVar5 < lVar11)) goto code_r0x0034d890;
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_68);
LAB_0034dc40:
              bVar6 = false;
            }
          }
        }
        else if ((int)uVar3 < 0x505) {
          if (uVar3 == 0x4fb) {
            lVar8 = (long)(((layer->layer_).convolution_)->kernelsize_).current_size_;
            if (lVar8 != 0) {
              lVar10 = 0;
              do {
                lVar5 = *(long *)((long)(((layer->layer_).convolution_)->kernelsize_).
                                        arena_or_elements_ + lVar10);
                if ((lVar5 < -iVar2) || (lVar11 <= lVar5)) {
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_68);
                  goto LAB_0034dc40;
                }
                lVar10 = lVar10 + 8;
              } while (lVar8 * 8 != lVar10);
            }
          }
          else if (uVar3 == 0x500) {
            lVar8 = (long)(((layer->layer_).convolution_)->kernelsize_).current_size_;
            if (lVar8 != 0) {
              lVar10 = 0;
              do {
                lVar5 = *(long *)((long)(((layer->layer_).convolution_)->kernelsize_).
                                        arena_or_elements_ + lVar10);
                if ((lVar5 < -iVar2) || (lVar11 <= lVar5)) {
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_68);
                  goto LAB_0034dc40;
                }
                lVar10 = lVar10 + 8;
              } while (lVar8 * 8 != lVar10);
            }
          }
        }
        else if (uVar3 == 0x505) {
          lVar8 = (long)(((layer->layer_).convolution_)->kernelsize_).current_size_;
          if (lVar8 != 0) {
            lVar10 = 0;
            do {
              lVar5 = *(long *)((long)(((layer->layer_).convolution_)->kernelsize_).
                                      arena_or_elements_ + lVar10);
              if ((lVar5 < -iVar2) || (lVar11 <= lVar5)) {
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_68);
                goto LAB_0034dc40;
              }
              lVar10 = lVar10 + 8;
            } while (lVar8 * 8 != lVar10);
          }
        }
        else if (uVar3 == 0x50a) {
          lVar8 = (long)(((layer->layer_).convolution_)->kernelsize_).current_size_;
          if (lVar8 != 0) {
            lVar10 = 0;
            do {
              lVar5 = *(long *)((long)(((layer->layer_).convolution_)->kernelsize_).
                                      arena_or_elements_ + lVar10);
              if ((lVar5 < -iVar2) || (lVar11 <= lVar5)) {
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_68);
                goto LAB_0034dc40;
              }
              lVar10 = lVar10 + 8;
            } while (lVar8 * 8 != lVar10);
          }
        }
        else if (uVar3 == 0x50f) {
          lVar8 = (long)(((layer->layer_).convolution_)->kernelsize_).current_size_;
          if (lVar8 != 0) {
            lVar10 = 0;
            do {
              lVar5 = *(long *)((long)(((layer->layer_).convolution_)->kernelsize_).
                                      arena_or_elements_ + lVar10);
              if ((lVar5 < -iVar2) || (lVar11 <= lVar5)) {
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_68);
                goto LAB_0034dc40;
              }
              lVar10 = lVar10 + 8;
            } while (lVar8 * 8 != lVar10);
          }
        }
LAB_0034dc42:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if (!bVar6) {
          return __return_storage_ptr__;
        }
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
code_r0x0034d890:
  lVar10 = lVar10 + 8;
  if (lVar8 * 8 == lVar10) goto LAB_0034dc42;
  goto LAB_0034d87a;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReductionTypeLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    // all given axes should be in range [-inputRank : inputRank)
    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";

        switch (layer.layer_case()) {
            case Specification::NeuralNetworkLayer::LayerCase::kReduceL1:
                for (const auto& axis : layer.reducel1().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceL2:
                for (const auto& axis : layer.reducel2().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceMax:
                for (const auto& axis : layer.reducemax().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceMin:
                for (const auto& axis : layer.reducemin().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceSum:
                for (const auto& axis : layer.reducesum().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceProd:
                for (const auto& axis : layer.reduceprod().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceMean:
                for (const auto& axis : layer.reducemean().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceLogSum:
                for (const auto& axis : layer.reducelogsum().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceSumSquare:
                for (const auto& axis : layer.reducesumsquare().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceLogSumExp:
                for (const auto& axis : layer.reducelogsumexp().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;

            default:
                break;
        }
    }
    return Result();
}